

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PackedArray.c
# Opt level: O1

uint32_t PackedArray_get(PackedArray *a,uint32_t offset)

{
  uint uVar1;
  uint32_t low;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (a == (PackedArray *)0x0) {
    __assert_fail("a != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ivan2kh[P]sort-big-file-with-a-limited-memory/PackedArray.c"
                  ,0x223,"uint32_t PackedArray_get(const PackedArray *, const uint32_t)");
  }
  uVar1 = a->bitsPerItem;
  uVar6 = (ulong)offset * (ulong)uVar1 >> 5;
  uVar4 = (uint)((ulong)offset * (ulong)uVar1) & 0x1f;
  uVar3 = 0x20 - uVar4;
  uVar5 = (int)(1L << ((byte)uVar1 & 0x3f)) - 1;
  uVar4 = a[1].padding[uVar6 - 2] >> (sbyte)uVar4;
  if (uVar3 < uVar1) {
    bVar2 = (byte)uVar3;
    return uVar4 ^ ((a[1].padding[uVar6 - 1] << (bVar2 & 0x1f) ^ uVar4) >> (bVar2 & 0x1f)) <<
                   (bVar2 & 0x1f) & uVar5;
  }
  return uVar4 & uVar5;
}

Assistant:

uint32_t PackedArray_get(const PackedArray* a, const uint32_t offset)
{
  const uint32_t* __restrict in;
  uint32_t bitsPerItem;
  uint32_t startBit;
  uint32_t bitsAvailable;
  uint32_t mask;
  uint32_t out;

  PACKEDARRAY_ASSERT(a != NULL);

  bitsPerItem = a->bitsPerItem;

  in = &a->buffer[((uint64_t)offset * (uint64_t)bitsPerItem) / 32];
  startBit = ((uint64_t)offset * (uint64_t)bitsPerItem) % 32;

  bitsAvailable = 32 - startBit;

  mask = (uint32_t)(1ULL << bitsPerItem) - 1;

  if (bitsPerItem <= bitsAvailable)
  {
    out = (in[0] >> startBit) & mask;
  }
  else
  {
    // out spans 2 buffer cells
    uint32_t low, high;

    low = in[0] >> startBit;
    high = in[1] << (32 - startBit);

    out = low ^ ((low ^ high) & (mask >> bitsAvailable << bitsAvailable));
  }

  return out;
}